

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

void __thiscall gl4cts::DirectStateAccess::Textures::BindUnitTest::CleanAll(BindUnitTest *this)

{
  GLuint *pGVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar4;
  undefined1 auVar5 [16];
  long lVar3;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  lVar4 = lVar3;
  if (this->m_po != 0) {
    (**(code **)(lVar3 + 0x1680))(0);
    lVar4 = (**(code **)(lVar3 + 0x448))(this->m_po);
    this->m_po = 0;
  }
  auVar5._0_4_ = -(uint)(this->m_to[0] == 0);
  auVar5._4_4_ = -(uint)(this->m_to[1] == 0);
  auVar5._8_4_ = -(uint)(this->m_to[2] == 0);
  auVar5._12_4_ = -(uint)(this->m_to[3] == 0);
  iVar2 = movmskps((int)lVar4,auVar5);
  if (iVar2 != 0xf) {
    pGVar1 = this->m_to;
    (**(code **)(lVar3 + 0x480))(4,pGVar1);
    pGVar1[0] = 0;
    pGVar1[1] = 0;
    this->m_to[2] = 0;
    this->m_to[3] = 0;
  }
  if (this->m_fbo != 0) {
    (**(code **)(lVar3 + 0x440))(1,&this->m_fbo);
    this->m_fbo = 0;
  }
  if (this->m_rbo != 0) {
    (**(code **)(lVar3 + 0x460))(1,&this->m_rbo);
    this->m_rbo = 0;
  }
  if (this->m_result != (GLubyte *)0x0) {
    operator_delete__(this->m_result);
  }
  do {
    iVar2 = (**(code **)(lVar3 + 0x800))();
  } while (iVar2 != 0);
  return;
}

Assistant:

void BindUnitTest::CleanAll()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Release GL objects. */
	if (m_po)
	{
		gl.useProgram(0);

		gl.deleteProgram(m_po);

		m_po = 0;
	}

	if (m_to[0] || m_to[1] || m_to[2] || m_to[3])
	{
		gl.deleteTextures(4, m_to);

		m_to[0] = 0;
		m_to[1] = 0;
		m_to[2] = 0;
		m_to[3] = 0;
	}

	if (m_fbo)
	{
		gl.deleteFramebuffers(1, &m_fbo);

		m_fbo = 0;
	}

	if (m_rbo)
	{
		gl.deleteRenderbuffers(1, &m_rbo);

		m_rbo = 0;
	}

	/* Release heap. */
	if (DE_NULL != m_result)
	{
		delete[] m_result;
	}

	/* Erros clean-up. */
	while (GL_NO_ERROR != gl.getError())
		;
}